

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_cpc.cpp
# Opt level: O3

void CDTUtil::writeBASICLoader(path *fname,byte screenMode,byte *palette)

{
  ulong uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  unkuint9 Var18;
  undefined1 auVar19 [11];
  undefined1 auVar20 [14];
  undefined1 auVar21 [12];
  unkbyte10 Var22;
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined8 uVar25;
  long lVar26;
  undefined1 auVar27 [16];
  char cVar28;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  undefined1 auVar29 [16];
  char cVar50;
  ushort uVar38;
  ushort uVar39;
  char cVar51;
  char cVar54;
  ushort uVar52;
  ushort uVar53;
  undefined4 uVar40;
  char cVar55;
  char cVar58;
  ushort uVar56;
  ushort uVar57;
  char cVar59;
  char cVar62;
  ushort uVar60;
  ushort uVar61;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar49 [16];
  byte p [32];
  string *local_e8;
  byte local_e0;
  undefined1 local_d8 [34];
  undefined2 local_b6;
  undefined1 local_b4;
  byte local_b3 [2];
  undefined1 local_b1;
  byte local_b0 [2];
  undefined1 local_ae;
  byte local_ad;
  byte local_ac;
  undefined1 local_ab;
  byte local_aa [2];
  undefined1 local_a8;
  byte local_a7 [2];
  undefined1 local_a5;
  byte local_a4 [2];
  undefined1 local_a2;
  byte local_a1 [2];
  undefined1 local_9f;
  byte local_9e;
  byte local_9d;
  undefined1 local_9c;
  byte local_9b [2];
  undefined1 local_99;
  byte local_98 [2];
  undefined1 local_96;
  byte local_95 [2];
  undefined1 local_93;
  byte local_92 [2];
  undefined1 local_90;
  byte local_8f;
  byte local_8e;
  undefined1 local_8d;
  byte local_8c;
  byte local_8b;
  undefined1 local_8a;
  byte local_89;
  byte local_88;
  undefined1 local_87;
  byte local_86;
  byte local_85;
  undefined8 local_84;
  undefined8 uStack_7c;
  undefined8 local_74;
  undefined8 uStack_6c;
  undefined8 local_64;
  undefined8 uStack_5c;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined8 local_34;
  undefined4 local_2c;
  char cVar37;
  undefined6 uVar41;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  
  local_d8[0x1d] = *palette;
  lVar26 = 0;
  do {
    uVar1 = *(ulong *)(palette + lVar26 + 1);
    cVar62 = (char)(uVar1 >> 0x38);
    auVar10._8_6_ = 0;
    auVar10._0_8_ = uVar1;
    auVar10[0xe] = cVar62;
    cVar59 = (char)(uVar1 >> 0x30);
    auVar11._8_4_ = 0;
    auVar11._0_8_ = uVar1;
    auVar11[0xc] = cVar59;
    auVar11._13_2_ = auVar10._13_2_;
    auVar12._8_4_ = 0;
    auVar12._0_8_ = uVar1;
    auVar12._12_3_ = auVar11._12_3_;
    cVar58 = (char)(uVar1 >> 0x28);
    auVar13._8_2_ = 0;
    auVar13._0_8_ = uVar1;
    auVar13[10] = cVar58;
    auVar13._11_4_ = auVar12._11_4_;
    auVar14._8_2_ = 0;
    auVar14._0_8_ = uVar1;
    auVar14._10_5_ = auVar13._10_5_;
    cVar55 = (char)(uVar1 >> 0x20);
    auVar15[8] = cVar55;
    auVar15._0_8_ = uVar1;
    auVar15._9_6_ = auVar14._9_6_;
    auVar17._7_8_ = 0;
    auVar17._0_7_ = auVar15._8_7_;
    cVar54 = (char)(uVar1 >> 0x18);
    Var18 = CONCAT81(SUB158(auVar17 << 0x40,7),cVar54);
    auVar23._9_6_ = 0;
    auVar23._0_9_ = Var18;
    cVar51 = (char)(uVar1 >> 0x10);
    auVar19._1_10_ = SUB1510(auVar23 << 0x30,5);
    auVar19[0] = cVar51;
    auVar24._11_4_ = 0;
    auVar24._0_11_ = auVar19;
    cVar50 = (char)(uVar1 >> 8);
    auVar16[2] = cVar50;
    auVar16._0_2_ = (ushort)uVar1;
    auVar16._3_12_ = SUB1512(auVar24 << 0x20,3);
    uVar38 = ((ushort)uVar1 & 0xff) * (short)DAT_00162be0;
    uVar52 = auVar16._2_2_ * DAT_00162be0._2_2_;
    uVar56 = auVar19._0_2_ * DAT_00162be0._4_2_;
    uVar60 = (short)Var18 * DAT_00162be0._6_2_;
    uVar63 = auVar15._8_2_ * DAT_00162be0._8_2_;
    uVar65 = auVar13._10_2_ * DAT_00162be0._10_2_;
    uVar67 = auVar11._12_2_ * DAT_00162be0._12_2_;
    uVar69 = (auVar10._13_2_ >> 8) * DAT_00162be0._14_2_;
    uVar39 = uVar38 >> 8;
    uVar53 = uVar52 >> 8;
    uVar57 = uVar56 >> 8;
    uVar61 = uVar60 >> 8;
    uVar64 = uVar63 >> 8;
    uVar66 = uVar65 >> 8;
    uVar68 = uVar67 >> 8;
    uVar70 = uVar69 >> 8;
    uVar38 = CONCAT11((uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53),
                      (uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39));
    uVar40 = CONCAT13((uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar60 >> 8) - (0xff < uVar61),
                      CONCAT12((uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) -
                               (0xff < uVar57),uVar38));
    uVar41 = CONCAT15((uVar66 != 0) * (uVar66 < 0x100) * (char)(uVar65 >> 8) - (0xff < uVar66),
                      CONCAT14((uVar64 != 0) * (uVar64 < 0x100) * (char)(uVar63 >> 8) -
                               (0xff < uVar64),uVar40));
    auVar42._0_2_ = uVar38 >> 3;
    auVar42._2_2_ = (ushort)((uint)uVar40 >> 0x13);
    auVar42._4_2_ = (ushort)((uint6)uVar41 >> 0x23);
    auVar42._6_2_ =
         (ushort)(CONCAT17((uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70),
                           CONCAT16((uVar68 != 0) * (uVar68 < 0x100) * (char)(uVar67 >> 8) -
                                    (0xff < uVar68),uVar41)) >> 0x33);
    auVar42._8_8_ = 0;
    auVar42 = auVar42 & _DAT_00162bf0;
    cVar28 = auVar42[0];
    auVar29[0] = cVar28 + s_00000000_00162c00[0];
    cVar30 = auVar42[1];
    cVar31 = auVar42[2];
    cVar32 = auVar42[3];
    cVar33 = auVar42[4];
    cVar34 = auVar42[5];
    cVar35 = auVar42[6];
    cVar37 = auVar42[7];
    cVar36 = cVar37 + s_00000000_00162c00[7];
    auVar48._0_14_ = auVar42._0_14_;
    auVar48[0xe] = cVar37;
    auVar48[0xf] = cVar37;
    auVar47._14_2_ = auVar48._14_2_;
    auVar47._0_13_ = auVar42._0_13_;
    auVar47[0xd] = cVar35;
    auVar46._13_3_ = auVar47._13_3_;
    auVar46._0_12_ = auVar42._0_12_;
    auVar46[0xc] = cVar35;
    auVar45._12_4_ = auVar46._12_4_;
    auVar45._0_11_ = auVar42._0_11_;
    auVar45[0xb] = cVar34;
    auVar44._11_5_ = auVar45._11_5_;
    auVar44._0_10_ = auVar42._0_10_;
    auVar44[10] = cVar34;
    auVar43._10_6_ = auVar44._10_6_;
    auVar43._0_9_ = auVar42._0_9_;
    auVar43[9] = cVar33;
    uVar25 = CONCAT71(auVar43._9_7_,cVar33);
    Var22 = CONCAT91(CONCAT81(uVar25,cVar32),cVar32);
    auVar21._2_10_ = Var22;
    auVar21[1] = cVar31;
    auVar21[0] = cVar31;
    auVar20._2_12_ = auVar21;
    auVar20[1] = cVar30;
    auVar20[0] = cVar30;
    auVar49._0_2_ = CONCAT11(cVar28,cVar28) * (short)DAT_00162c10;
    auVar49._2_2_ = auVar20._0_2_ * DAT_00162c10._2_2_;
    auVar49._4_2_ = auVar21._0_2_ * DAT_00162c10._4_2_;
    auVar49._6_2_ = (short)Var22 * DAT_00162c10._6_2_;
    auVar49._8_2_ = (short)uVar25 * DAT_00162c10._8_2_;
    auVar49._10_2_ = auVar44._10_2_ * DAT_00162c10._10_2_;
    auVar49._12_2_ = auVar46._12_2_ * DAT_00162c10._12_2_;
    auVar49._14_2_ = auVar47._14_2_ * DAT_00162c10._14_2_;
    auVar49 = auVar49 & _DAT_00162c20;
    sVar2 = auVar49._0_2_;
    sVar3 = auVar49._2_2_;
    sVar4 = auVar49._4_2_;
    sVar5 = auVar49._6_2_;
    sVar6 = auVar49._8_2_;
    sVar7 = auVar49._10_2_;
    sVar8 = auVar49._12_2_;
    sVar9 = auVar49._14_2_;
    auVar27[0] = (char)uVar1 - ((0 < sVar2) * (sVar2 < 0x100) * auVar49[0] - (0xff < sVar2));
    auVar27[1] = cVar50 - ((0 < sVar3) * (sVar3 < 0x100) * auVar49[2] - (0xff < sVar3));
    auVar27[2] = cVar51 - ((0 < sVar4) * (sVar4 < 0x100) * auVar49[4] - (0xff < sVar4));
    auVar27[3] = cVar54 - ((0 < sVar5) * (sVar5 < 0x100) * auVar49[6] - (0xff < sVar5));
    auVar27[4] = cVar55 - ((0 < sVar6) * (sVar6 < 0x100) * auVar49[8] - (0xff < sVar6));
    auVar27[5] = cVar58 - ((0 < sVar7) * (sVar7 < 0x100) * auVar49[10] - (0xff < sVar7));
    auVar27[6] = cVar59 - ((0 < sVar8) * (sVar8 < 0x100) * auVar49[0xc] - (0xff < sVar8));
    auVar27[7] = cVar62 - ((0 < sVar9) * (sVar9 < 0x100) * auVar49[0xe] - (0xff < sVar9));
    auVar27[8] = -((0 < sVar2) * (sVar2 < 0x100) * auVar49[0] - (0xff < sVar2));
    auVar27[9] = -((0 < sVar3) * (sVar3 < 0x100) * auVar49[2] - (0xff < sVar3));
    auVar27[10] = -((0 < sVar4) * (sVar4 < 0x100) * auVar49[4] - (0xff < sVar4));
    auVar27[0xb] = -((0 < sVar5) * (sVar5 < 0x100) * auVar49[6] - (0xff < sVar5));
    auVar27[0xc] = -((0 < sVar6) * (sVar6 < 0x100) * auVar49[8] - (0xff < sVar6));
    auVar27[0xd] = -((0 < sVar7) * (sVar7 < 0x100) * auVar49[10] - (0xff < sVar7));
    auVar27[0xe] = -((0 < sVar8) * (sVar8 < 0x100) * auVar49[0xc] - (0xff < sVar8));
    auVar27[0xf] = -((0 < sVar9) * (sVar9 < 0x100) * auVar49[0xe] - (0xff < sVar9));
    auVar27 = auVar27 | _s_00000000_00162c00;
    auVar29._8_8_ =
         (undefined8)
         (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(auVar27[7],cVar36),
                                                                auVar27[6]),
                                                       cVar35 + s_00000000_00162c00[6]),auVar27[5]),
                                     cVar34 + s_00000000_00162c00[5]),auVar27[4]),
                   CONCAT11(cVar33 + s_00000000_00162c00[4],cVar36)) >> 8);
    auVar29[7] = auVar27[3];
    auVar29[6] = cVar32 + s_00000000_00162c00[3];
    auVar29[5] = auVar27[2];
    auVar29[4] = cVar31 + s_00000000_00162c00[2];
    auVar29[3] = auVar27[1];
    auVar29[2] = cVar30 + s_00000000_00162c00[1];
    auVar29[1] = auVar27[0];
    *(undefined1 (*) [16])(p + lVar26 * 2) = auVar29;
    lVar26 = lVar26 + 8;
  } while (lVar26 != 0x10);
  local_d8._16_4_ = 0xa000f;
  local_d8._20_2_ = 0x20ad;
  local_d8[0x16] = (&DAT_0016338e)[screenMode];
  local_d8._23_4_ = 0x82018a01;
  local_d8._27_2_ = 0x1920;
  local_d8._30_4_ = 0x14003600;
  local_b6 = 0x8c00;
  local_b4 = 0x20;
  local_b3[0] = p[0];
  local_b3[1] = p[1];
  local_b1 = 0x2c;
  local_b0[0] = p[2];
  local_b0[1] = p[3];
  local_ae = 0x2c;
  local_ad = p[4];
  local_ac = p[5];
  local_ab = 0x2c;
  local_aa[0] = p[6];
  local_aa[1] = p[7];
  local_a8 = 0x2c;
  local_a7[0] = p[8];
  local_a7[1] = p[9];
  local_a5 = 0x2c;
  local_a4[0] = p[10];
  local_a4[1] = p[0xb];
  local_a2 = 0x2c;
  local_a1[0] = p[0xc];
  local_a1[1] = p[0xd];
  local_9f = 0x2c;
  local_9e = p[0xe];
  local_9d = p[0xf];
  local_9c = 0x2c;
  local_9b[0] = p[0x10];
  local_9b[1] = p[0x11];
  local_99 = 0x2c;
  local_98[0] = p[0x12];
  local_98[1] = p[0x13];
  local_96 = 0x2c;
  local_95[0] = p[0x14];
  local_95[1] = p[0x15];
  local_93 = 0x2c;
  local_92[0] = p[0x16];
  local_92[1] = p[0x17];
  local_90 = 0x2c;
  local_8f = p[0x18];
  local_8e = p[0x19];
  local_8d = 0x2c;
  local_8c = p[0x1a];
  local_8b = p[0x1b];
  local_8a = 0x2c;
  local_89 = p[0x1c];
  local_88 = p[0x1d];
  local_87 = 0x2c;
  local_86 = p[0x1e];
  local_85 = p[0x1f];
  local_84 = 0xd209e001e001200;
  uStack_7c = 0x20ec200eefe90000;
  local_74 = 0xc30028001e000f19;
  uStack_6c = 0x20a201f600000d20;
  local_64 = 0xd202ce900000d;
  uStack_5c = 0xf600000d202cf600;
  local_54 = 0xd20b00032000b00;
  uStack_4c = 0x3c001400e90000;
  local_44 = 0x20a8017fff1c20aa;
  uStack_3c = 0x2265646f632122;
  local_34 = 0x1c20830046000a;
  local_2c = 0x80;
  local_e8 = (string *)local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"LOADER","");
  writeTapeFile(fname,local_e8,local_e0,(byte *)0x0,(int)local_d8 + 0x10,0xa0,0x170,0);
  if (local_e8 != (string *)local_d8) {
    operator_delete(local_e8,(ulong)(local_d8._0_8_ + 1));
  }
  return;
}

Assistant:

static void writeBASICLoader(const std::filesystem::path & fname, byte screenMode, const byte* palette) {
		constexpr byte mode_values[] = { 0x0E, 0x0F, 0x10 };
		byte border = 0;
		border = *palette;
		// Border is always the first entry in the palette
		++palette;

		// BASIC number encoding format for the palette entries
		byte p[32];
		for (aint i = 0, n = 0; i < 16; ++i, n+=2) {
			p[n] = (palette[i] / 10) + '0';
			p[n+1] = (palette[i] % 10) + '0';
		}

		const word callad = SaveCDT_AmstradCPC464_ORG;
		const word himem = callad - 1; // himem is one byte lower than the program we load

		// BASIC loader to set the screen mode, border color, palette, and then load the asm loader and execute it
		const byte basic[] = {
			// Line format <Line Len (int16)> <line no (int16)> <tokens...> <0x00>
			//
			//		10		MODE		N						:		CLS  :     BORDER		N
			15, 00, 10, 00, 0xAD, 0x20, mode_values[screenMode], 0x01, 0x8A, 0x01, 0x82, 0x20, 0x19, border, 0x00,
			//		20		DATA [16 bytes of int8]
			54, 00, 20, 00, 0x8C, 0x20, 
				p[0], p[1], ',', p[2], p[3], ',', p[4], p[5], ',', p[6], p[7], ',',
				p[8], p[9], ',', p[10], p[11], ',', p[12], p[13], ',', p[14], p[15], ',',
				p[16], p[17], ',', p[18], p[19], ',', p[20], p[21], ',', p[22], p[23], ',',
				p[24], p[25], ',', p[26], p[27], ',', p[28], p[29], ',', p[30], p[31], 0x00,
			//		30		FOR			i						=	  0			  TO		  15
			18, 00,	30, 00, 0x9E, 0x20, 0x0D, 0x00, 0x00, 0xE9, 0xEF, 0x0E, 0x20, 0xEC, 0x20, 0x19, 0x0F, 0x00,
			//		40		READ		v						:	  INK		  	i					  ,           v                       ,                             v
			30, 00, 40, 00, 0xC3, 0x20, 0x0D, 0x00, 0x00, 0xF6, 0x01, 0xA2, 0x20, 0x0D, 0x00, 0x00, 0xE9, 0x2C, 0x20, 0x0D, 0x00, 0x00, 0xF6, 0x2C, 0x20, 0x0D, 0x00, 0x00, 0xF6, 0x00,
			//		50		NEXT		i
			11, 00,	50, 00, 0xB0, 0x20, 0x0D, 0x00, 0x00, 0xE9, 0x00,
			//		60		MEMORY		&NNNN			  :		LOAD 
			20, 00, 60, 00, 0xAA, 0x20, 0x1C, himem & 0xFF, himem >> 8, 0x01,	0xA8, 0x20, 0x22, '!', 'c', 'o', 'd', 'e', 0x22, 0x00,
			//		70		CALL
			10, 00, 70, 00, 0x83, 0x20, 0x1C, callad & 0xFF, callad >> 8, 0x00,
			// EOF
			00, 00 
		};
		constexpr aint basiclen = sizeof(basic);
		writeTapeFile(fname, "LOADER", FileTypeBASIC, basic, basiclen, 0x0170, 0x0000, DefaultPause);
	}